

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigslot.h
# Opt level: O1

void __thiscall
sigslot::
_signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
::~_signal_base2(_signal_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
                 *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR___signal_base2_001aadc8;
  disconnect_all(this);
  p_Var2 = (this->m_connected_slots).
           super__List_base<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*,_std::allocator<sigslot::_connection_base2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_connected_slots) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  (this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__multi_threaded_local_001a69e0;
  pthread_mutex_destroy
            ((pthread_mutex_t *)
             &(this->super__signal_base<sigslot::multi_threaded_local>).super_multi_threaded_local.
              m_mutex);
  return;
}

Assistant:

~_signal_base2()
		{
			disconnect_all();
		}